

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::~D3MFExporter(D3MFExporter *this)

{
  pointer ppOVar1;
  pointer ppOVar2;
  OpcPackageRelationship *this_00;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppOVar1 = (this->mRelations).
              super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (this->mRelations).
              super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppOVar2 - (long)ppOVar1 >> 3) <= uVar3) break;
    this_00 = ppOVar1[uVar3];
    if (this_00 != (OpcPackageRelationship *)0x0) {
      OpcPackageRelationship::~OpcPackageRelationship(this_00);
    }
    operator_delete(this_00,0x60);
    uVar3 = uVar3 + 1;
  }
  if (ppOVar2 != ppOVar1) {
    (this->mRelations).
    super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppOVar1;
  }
  std::
  _Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
  ::~_Vector_base(&(this->mRelations).
                   super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mContentOutput);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mRelOutput);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mModelOutput);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

D3MFExporter::~D3MFExporter() {
    for ( size_t i = 0; i < mRelations.size(); ++i ) {
        delete mRelations[ i ];
    }
    mRelations.clear();
}